

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::TexelBufferDescriptorCase::
genResourceAccessSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ostringstream buf;
  
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 0) {
    pcVar4 = "";
    pcVar5 = "";
  }
  else if (iVar1 == 1) {
    pcVar4 = "A";
    pcVar5 = "B";
  }
  else {
    pcVar4 = "[0]";
    if (iVar1 != 3) {
      pcVar4 = (char *)0x0;
    }
    pcVar5 = "[1]";
    if (iVar1 != 3) {
      pcVar5 = (char *)0x0;
    }
  }
  uVar2 = *(int *)((long)this + 0x84) - 4;
  if (uVar2 < 5) {
    pcVar6 = &DAT_009868c0 + *(int *)(&DAT_009868c0 + (ulong)uVar2 * 4);
  }
  else {
    pcVar6 = "imageLoad";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar3 = std::operator<<((ostream *)&buf,"\tif (quadrant_id == 0)\n");
  poVar3 = std::operator<<(poVar3,"\t\tresult_color = ");
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"(u_texelBuffer");
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
  poVar3 = std::operator<<(poVar3,");\n");
  poVar3 = std::operator<<(poVar3,"\telse if (quadrant_id == 1)\n");
  poVar3 = std::operator<<(poVar3,"\t\tresult_color = ");
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"(u_texelBuffer");
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x33);
  poVar3 = std::operator<<(poVar3,");\n");
  poVar3 = std::operator<<(poVar3,"\telse if (quadrant_id == 2)\n");
  poVar3 = std::operator<<(poVar3,"\t\tresult_color = ");
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"(u_texelBuffer");
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2a);
  poVar3 = std::operator<<(poVar3,");\n");
  poVar3 = std::operator<<(poVar3,"\telse\n");
  poVar3 = std::operator<<(poVar3,"\t\tresult_color = ");
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"(u_texelBuffer");
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x19);
  std::operator<<(poVar3,");\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelBufferDescriptorCase::genResourceAccessSource (vk::VkShaderStageFlagBits stage) const
{
	DE_UNREF(stage);

	const char* const	accessPostfixA	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("A")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[0]")
										: (DE_NULL);
	const char* const	accessPostfixB	= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR)						? ("")
										: (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)		? ("B")
										: (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY)						? ("[1]")
										: (DE_NULL);
	const char* const	fetchFunc		= (isUniformDescriptorType(m_descriptorType)) ? ("texelFetch") : ("imageLoad");
	std::ostringstream	buf;

	buf << "	if (quadrant_id == 0)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(0) << ");\n"
		<< "	else if (quadrant_id == 1)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(1) << ");\n"
		<< "	else if (quadrant_id == 2)\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixA << ", " << TexelBufferInstanceBuffers::getFetchPos(2) << ");\n"
		<< "	else\n"
		<< "		result_color = " << fetchFunc << "(u_texelBuffer" << accessPostfixB << ", " << TexelBufferInstanceBuffers::getFetchPos(3) << ");\n";

	return buf.str();
}